

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O3

bool __thiscall
psy::C::Parser::parseExtKR_ParameterDeclaration
          (Parser *this,ExtKR_ParameterDeclarationSyntax **paramDecl)

{
  DeclaratorListSyntax *pDVar1;
  bool bVar2;
  ExtKR_ParameterDeclarationSyntax *pEVar3;
  SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*> *pSVar4;
  SyntaxToken *pSVar5;
  IndexType IVar6;
  DeclaratorListSyntax **ppDVar7;
  SpecifierListSyntax *specList;
  DeclarationSyntax *decl;
  DeclaratorSyntax *local_40;
  SpecifierListSyntax *local_38;
  DeclarationSyntax *local_30;
  
  local_30 = (DeclarationSyntax *)0x0;
  local_38 = (SpecifierListSyntax *)0x0;
  bVar2 = parseDeclarationSpecifiers(this,&local_30,&local_38,Unspecified);
  if (bVar2) {
    pEVar3 = makeNode<psy::C::ExtKR_ParameterDeclarationSyntax>(this);
    *paramDecl = pEVar3;
    pEVar3->specs_ = local_38;
    pEVar3 = *paramDecl;
    local_40 = (DeclaratorSyntax *)0x0;
    bVar2 = parseDeclarator(this,&local_40,Parameter,Concrete);
    if (bVar2) {
      ppDVar7 = &pEVar3->decltors_;
      do {
        pSVar4 = makeNode<psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax*>,psy::C::DeclaratorSyntax*&>
                           (this,&local_40);
        *ppDVar7 = pSVar4;
        pSVar5 = peek(this,1);
        if (pSVar5->syntaxK_ != CommaToken) {
          if (pSVar5->syntaxK_ == SemicolonToken) {
            IVar6 = consume(this);
            (*paramDecl)->semicolonTkIdx_ = IVar6;
            return true;
          }
          return false;
        }
        IVar6 = consume(this);
        pDVar1 = *ppDVar7;
        pDVar1->delimTkIdx_ = (uint)IVar6;
        ppDVar7 = &(pDVar1->
                   super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                   ).
                   super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                   .next;
        local_40 = (DeclaratorSyntax *)0x0;
        bVar2 = parseDeclarator(this,&local_40,Parameter,Concrete);
      } while (bVar2);
    }
  }
  return false;
}

Assistant:

bool Parser::parseExtKR_ParameterDeclaration(ExtKR_ParameterDeclarationSyntax*& paramDecl)
{
    DBG_THIS_RULE();

    DeclarationSyntax* decl = nullptr;
    SpecifierListSyntax* specList = nullptr;
    if (!parseDeclarationSpecifiers(decl, specList, DeclarationContext::Unspecified))
        return false;

    paramDecl = makeNode<ExtKR_ParameterDeclarationSyntax>();
    paramDecl->specs_ = specList;

    DeclaratorListSyntax** decltorList_cur = &paramDecl->decltors_;
    while (true) {
        DeclaratorSyntax* decltor = nullptr;
        if (!parseDeclarator(decltor, DeclarationContext::Parameter))
            return false;

        *decltorList_cur = makeNode<DeclaratorListSyntax>(decltor);
        switch (peek().kind()) {
            case SyntaxKind::CommaToken:
                (*decltorList_cur)->delimTkIdx_ = consume();
                decltorList_cur = &(*decltorList_cur)->next;
                break;

            case SyntaxKind::SemicolonToken:
                paramDecl->semicolonTkIdx_ = consume();
                return true;

            default:
                return false;
        }
    }
}